

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
phmap::priv::
btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
::try_shrink(btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
             *this)

{
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
  *pbVar1;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
  *this_00;
  
  pbVar1 = (this->root_).
           super__Tuple_impl<0UL,_phmap::priv::StringBtreeDefaultLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_*>
           .
           super__Tuple_impl<1UL,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_*>
           .
           super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_*>
           .
           super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_*,_false>
           ._M_head_impl;
  if (((ulong)pbVar1 & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,
                  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>> *, unsigned char, std::basic_string<char>, phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>> *, unsigned char, std::basic_string<char>, phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
                 );
  }
  if (pbVar1[10] ==
      (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
       )0x0) {
    if (pbVar1[0xb] ==
        (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
         )0x0) {
      this_00 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
                ::child(pbVar1,0);
      btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
      ::make_root(this_00);
      pbVar1 = (this->root_).
               super__Tuple_impl<0UL,_phmap::priv::StringBtreeDefaultLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_*>
               .
               super__Tuple_impl<1UL,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_*>
               .
               super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_*>
               .
               super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_*,_false>
               ._M_head_impl;
      btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
      ::destroy(pbVar1,(allocator_type *)this);
      operator_delete(pbVar1,0x130);
      (this->root_).
      super__Tuple_impl<0UL,_phmap::priv::StringBtreeDefaultLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_*>
      .
      super__Tuple_impl<1UL,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_*>
      .
      super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_*>
      .
      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_*,_false>
      ._M_head_impl = this_00;
    }
    else {
      if (this->size_ != 0) {
        __assert_fail("size() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xbfc,
                      "void phmap::priv::btree<phmap::priv::set_params<std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>>::try_shrink() [Params = phmap::priv::set_params<std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>]"
                     );
      }
      delete_leaf_node(this,pbVar1);
      (this->root_).
      super__Tuple_impl<0UL,_phmap::priv::StringBtreeDefaultLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_*>
      .
      super__Tuple_impl<1UL,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_*>
      .
      super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_*>
      .
      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_*,_false>
      ._M_head_impl =
           (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
            *)&btree<phmap::priv::set_params<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,false>>
               ::EmptyNode()::empty_node_abi_cxx11_;
      this->rightmost_ =
           (node_type *)
           &btree<phmap::priv::set_params<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,false>>
            ::EmptyNode()::empty_node_abi_cxx11_;
    }
  }
  return;
}

Assistant:

node_type *root() { return std::get<2>(root_); }